

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Model * gvr::loadDepth(char *name,char *spath,bool verbose)

{
  float fVar1;
  float *pfVar2;
  pointer piVar3;
  pointer piVar4;
  uint *puVar5;
  uchar *puVar6;
  uchar **ppuVar7;
  float fVar8;
  char cVar9;
  int i_1;
  int iVar10;
  int iVar11;
  ColoredMesh *this;
  long lVar12;
  long *plVar13;
  undefined8 uVar14;
  Matrix33d *pMVar15;
  ulong uVar16;
  char *extraout_RDX;
  bool bVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  uchar ***pppuVar26;
  char *pcVar27;
  uint uVar28;
  char *pcVar29;
  char *pcVar30;
  long lVar31;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar32;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar33;
  long lVar34;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar35;
  bool bVar36;
  float fVar37;
  double ret;
  double dVar38;
  float fVar39;
  vector<int,_std::allocator<int>_> line0;
  SVector<double,_3> ret_1;
  Vector2d p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  View view;
  vector<int,_std::allocator<int>_> line1;
  int local_1c0;
  float local_1a4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_198;
  char *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ulong local_140;
  double local_138;
  double dStack_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  long *local_110;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_108;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_100;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_f8;
  uint local_c0;
  char *local_b8;
  long local_b0;
  long *local_90;
  long *local_88;
  float local_80;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_78;
  long local_40;
  long *local_38;
  
  pIVar32 = &local_f8;
  gimage::View::View((View *)pIVar32);
  gimage::loadView((View *)pIVar32,name,spath,verbose);
  local_1a4 = local_80;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_198,name,(allocator *)&local_78);
  gutil::split((vector *)&local_128,(string *)&local_198,',',true);
  if ((long *)local_198._0_8_ != &local_198.height) {
    operator_delete((void *)local_198._0_8_);
  }
  if (0x20 < (ulong)((long)local_128.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_128.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar19 = 1;
    lVar34 = 0x20;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((long)&((local_128.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar34,0,(char *)0x2);
      if (iVar10 == 0) {
        std::__cxx11::string::substr
                  ((ulong)&local_198,
                   (long)&((local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar34);
        uVar14 = local_198._0_8_;
        dVar38 = atof((char *)local_198._0_8_);
        if ((long *)uVar14 != &local_198.height) {
          operator_delete((void *)uVar14);
        }
        local_1a4 = (float)dVar38;
      }
      uVar19 = uVar19 + 1;
      lVar34 = lVar34 + 0x20;
    } while (uVar19 < (ulong)((long)local_128.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_b0 < 1) {
    uVar18 = 0;
  }
  else {
    lVar34 = 0;
    uVar18 = 0;
    do {
      if (0 < (long)local_b8) {
        pcVar27 = (char *)0x0;
        do {
          if ((int)local_c0 < 1) {
            uVar28 = 1;
          }
          else {
            uVar28 = 0;
            if ((*(uint *)(*(long *)(*local_90 + lVar34 * 8) + (long)pcVar27 * 4) & 0x7fffffff) <
                0x7f800000) {
              uVar19 = 1;
              do {
                uVar16 = uVar19;
                if (local_c0 == uVar16) break;
                uVar19 = uVar16 + 1;
              } while ((*(uint *)(*(long *)(local_90[uVar16] + lVar34 * 8) + (long)pcVar27 * 4) &
                       0x7fffffff) < 0x7f800000);
              uVar28 = (uint)(local_c0 <= uVar16);
            }
          }
          uVar18 = uVar18 + uVar28;
          pcVar27 = pcVar27 + 1;
        } while (pcVar27 != local_b8);
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != local_b0);
  }
  if ((local_f8.width < 1) || (local_f8.height < 1)) {
    this = (ColoredMesh *)operator_new(0xc0);
    Mesh::Mesh((Mesh *)this);
    (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,(ulong)uVar18,1);
  }
  else {
    this = (ColoredMesh *)operator_new(200);
    ColoredMesh::ColoredMesh(this);
    (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,(ulong)uVar18,1,1);
    local_198._0_8_ = (ulong)(uint)local_198._4_4_ << 0x20;
    local_198.row = (uchar **)0x0;
    local_198.img = (uchar ***)0x0;
    local_198.n = 0;
    local_198.pixel = (uchar *)0x0;
    local_198.width = 0;
    local_198.height = 0;
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_198,0,0,1);
    iVar10 = (int)((long)(local_b8 + local_f8.width + -1) / (long)local_b8);
    if (iVar10 < 2) {
      if (local_f8.height < local_b0 || local_f8.width < (long)local_b8) {
        gimage::resizeImageBilinear<unsigned_char>(&local_78,&local_f8,(long)local_b8,local_b0);
        goto LAB_001157de;
      }
    }
    else {
      gimage::downscaleImage<unsigned_char>(&local_78,&local_f8,iVar10);
LAB_001157de:
      pppuVar26 = local_198.img;
      ppuVar7 = local_198.row;
      puVar6 = local_198.pixel;
      lVar22 = local_198.n;
      lVar12 = local_198.height;
      lVar34 = local_198.width;
      iVar10 = local_198.depth;
      local_198.depth = local_78.depth;
      local_78.depth = iVar10;
      local_198.width = local_78.width;
      local_198.height = local_78.height;
      local_78.width = lVar34;
      local_78.height = lVar12;
      local_198.n = local_78.n;
      local_78.n = lVar22;
      local_198.pixel = local_78.pixel;
      local_198.row = local_78.row;
      local_78.pixel = puVar6;
      local_78.row = ppuVar7;
      local_198.img = local_78.img;
      local_78.img = pppuVar26;
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_78);
      local_f8.height = local_198.height;
      pIVar32 = &local_198;
    }
    if (0 < local_f8.height) {
      lVar34 = pIVar32->width;
      lVar12 = 0;
      iVar10 = 0;
      do {
        if (0 < lVar34) {
          lVar22 = 0;
          do {
            uVar19 = (ulong)(int)local_c0;
            if ((long)uVar19 < 1) {
LAB_001158cb:
              iVar11 = pIVar32->depth;
              lVar34 = (long)iVar10 * 3;
              this->rgb[lVar34] = (*pIVar32->img)[lVar12][lVar22];
              if (iVar11 == 3) {
                this->rgb[lVar34 + 1] = pIVar32->img[1][lVar12][lVar22];
                pppuVar26 = pIVar32->img + 2;
              }
              else {
                this->rgb[lVar34 + 1] = (*pIVar32->img)[lVar12][lVar22];
                pppuVar26 = pIVar32->img;
              }
              this->rgb[lVar34 + 2] = (*pppuVar26)[lVar12][lVar22];
              iVar10 = iVar10 + 1;
              lVar34 = pIVar32->width;
            }
            else if ((*(uint *)(*(long *)(*local_90 + lVar12 * 8) + lVar22 * 4) & 0x7fffffff) <
                     0x7f800000) {
              uVar16 = 1;
              do {
                uVar23 = uVar16;
                if (uVar19 == uVar23) break;
                uVar16 = uVar23 + 1;
              } while ((*(uint *)(*(long *)(local_90[uVar23] + lVar12 * 8) + lVar22 * 4) &
                       0x7fffffff) < 0x7f800000);
              if (uVar19 <= uVar23) goto LAB_001158cb;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < lVar34);
          local_f8.height = pIVar32->height;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_f8.height);
    }
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_198);
  }
  lVar34 = 0x10;
  do {
    (this->super_Mesh).super_PointCloud.super_Model.origin.v[lVar34 + -0x10] =
         (double)local_88[lVar34];
    lVar34 = lVar34 + 1;
  } while (lVar34 != 0x13);
  cVar9 = (**(code **)(*local_88 + 0x18))(local_88);
  if (cVar9 != '\0') {
    plVar13 = local_88 + 7;
    pMVar15 = &(this->super_Mesh).super_PointCloud.super_Model.Rc;
    lVar34 = 0;
    do {
      lVar12 = 0;
      do {
        pMVar15->v[0][lVar12] = (double)plVar13[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar34 = lVar34 + 1;
      pMVar15 = (Matrix33d *)(pMVar15->v + 1);
      plVar13 = plVar13 + 3;
    } while (lVar34 != 3);
    *(undefined1 (*) [16])(this->super_Mesh).super_PointCloud.super_Model.Tc.v = ZEXT816(0);
    (this->super_Mesh).super_PointCloud.super_Model.Tc.v[2] = 0.0;
  }
  if (0 < local_b0) {
    lVar12 = 0;
    iVar10 = 0;
    lVar34 = local_b0;
    pcVar27 = local_b8;
    do {
      if (0 < (long)pcVar27) {
        lVar22 = 0;
        do {
          uVar19 = (ulong)(int)local_c0;
          if ((long)uVar19 < 1) {
            fVar37 = *(float *)(*(long *)(*local_90 + lVar12 * 8) + lVar22 * 4);
LAB_00115ac2:
            local_138 = (double)lVar22 + 0.5;
            local_198.height = 0;
            local_198._0_8_ = (char *)0x0;
            local_198.width = 0;
            local_78.height = 0;
            local_78._0_8_ = (void *)0x0;
            local_78.width = 0;
            dStack_130 = (double)lVar12 + 0.5;
            (**(code **)(*local_88 + 0x40))(local_88,&local_198,&local_138);
            pfVar2 = (this->super_Mesh).super_PointCloud.vertex;
            lVar31 = (long)(iVar10 * 3);
            pfVar2[lVar31] = (float)((double)local_198._0_8_ - (double)local_88[0x10]);
            pfVar2[lVar31 + 1] = (float)((double)local_198.width - (double)local_88[0x11]);
            pfVar2[lVar31 + 2] = (float)((double)local_198.height - (double)local_88[0x12]);
            local_138 = local_138 + 0.5;
            dStack_130 = dStack_130 + 0.5;
            (**(code **)(*local_88 + 0x40))((double)fVar37,local_88,&local_78,&local_138);
            local_160 = (char *)(lVar31 + 2);
            local_158 = 0;
            uStack_150 = 0;
            local_148 = 0;
            lVar34 = 0;
            do {
              (&local_158)[lVar34] =
                   *(double *)(&local_78.depth + lVar34 * 2) -
                   *(double *)(&local_198.depth + lVar34 * 2);
              lVar34 = lVar34 + 1;
            } while (lVar34 != 3);
            dVar38 = 0.0;
            lVar34 = 0;
            do {
              dVar38 = dVar38 + (double)(&local_158)[lVar34] * (double)(&local_158)[lVar34];
              lVar34 = lVar34 + 1;
            } while (lVar34 != 3);
            if (dVar38 < 0.0) {
              dVar38 = sqrt(dVar38);
            }
            else {
              dVar38 = SQRT(dVar38);
            }
            (this->super_Mesh).super_PointCloud.scanprop[lVar31] = (float)(dVar38 + dVar38);
            local_138 = local_138 + -0.5;
            dStack_130 = dStack_130 + -0.5;
            (**(code **)(*local_88 + 0x40))((double)fVar37 + 0.5,local_88,&local_78,&local_138);
            local_158 = 0;
            uStack_150 = 0;
            local_148 = 0;
            lVar34 = 0;
            do {
              (&local_158)[lVar34] =
                   *(double *)(&local_78.depth + lVar34 * 2) -
                   *(double *)(&local_198.depth + lVar34 * 2);
              lVar34 = lVar34 + 1;
            } while (lVar34 != 3);
            dVar38 = 0.0;
            lVar34 = 0;
            do {
              dVar38 = dVar38 + (double)(&local_158)[lVar34] * (double)(&local_158)[lVar34];
              lVar34 = lVar34 + 1;
            } while (lVar34 != 3);
            if (dVar38 < 0.0) {
              dVar38 = sqrt(dVar38);
            }
            else {
              dVar38 = SQRT(dVar38);
            }
            pfVar2 = (this->super_Mesh).super_PointCloud.scanprop;
            pfVar2[lVar31 + 1] = (float)dVar38;
            pfVar2[lVar31 + 2] = 1.0;
            pfVar2 = (this->super_Mesh).super_PointCloud.scanpos;
            pfVar2[lVar31] = 0.0;
            pfVar2[lVar31 + 1] = 0.0;
            pfVar2[(long)local_160] = 0.0;
            iVar10 = iVar10 + 1;
            pcVar27 = local_b8;
          }
          else {
            fVar37 = *(float *)(*(long *)(*local_90 + lVar12 * 8) + lVar22 * 4);
            if ((uint)ABS(fVar37) < 0x7f800000) {
              uVar16 = 1;
              do {
                uVar23 = uVar16;
                if (uVar19 == uVar23) break;
                uVar16 = uVar23 + 1;
              } while ((*(uint *)(*(long *)(local_90[uVar23] + lVar12 * 8) + lVar22 * 4) &
                       0x7fffffff) < 0x7f800000);
              if (uVar19 <= uVar23) goto LAB_00115ac2;
            }
          }
          lVar22 = lVar22 + 1;
          lVar34 = local_b0;
        } while (lVar22 < (long)pcVar27);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < lVar34);
    if (1 < lVar34) {
      lVar12 = 1;
      uVar19 = 0;
      do {
        if (1 < (long)local_b8) {
          pcVar27 = (char *)0x1;
          do {
            lVar22 = 0;
            iVar10 = 0;
            fVar39 = 3.4028235e+38;
            fVar37 = -3.4028235e+38;
            bVar36 = true;
            do {
              bVar17 = bVar36;
              lVar22 = lVar22 + lVar12;
              lVar31 = 0;
              bVar36 = true;
              do {
                bVar21 = bVar36;
                pcVar30 = pcVar27 + lVar31;
                if ((int)local_c0 < 1) {
                  fVar1 = *(float *)(*(long *)(*local_90 + lVar22 * 8) + (long)pcVar30 * 4);
LAB_00115e31:
                  fVar8 = fVar1;
                  if (fVar39 <= fVar1) {
                    fVar8 = fVar39;
                  }
                  fVar39 = fVar8;
                  if (fVar1 <= fVar37) {
                    fVar1 = fVar37;
                  }
                  iVar10 = iVar10 + 1;
                  fVar37 = fVar1;
                }
                else {
                  fVar1 = *(float *)(*(long *)(*local_90 + lVar22 * 8) + (long)pcVar30 * 4);
                  if ((uint)ABS(fVar1) < 0x7f800000) {
                    uVar16 = 1;
                    do {
                      uVar23 = uVar16;
                      if (local_c0 == uVar23) break;
                      uVar16 = uVar23 + 1;
                    } while ((*(uint *)(*(long *)(local_90[uVar23] + lVar22 * 8) + (long)pcVar30 * 4
                                       ) & 0x7fffffff) < 0x7f800000);
                    if (local_c0 <= uVar23) goto LAB_00115e31;
                  }
                }
                lVar31 = -1;
                bVar36 = false;
              } while (bVar21);
              lVar22 = -1;
              bVar36 = false;
            } while (bVar17);
            iVar11 = iVar10 + -2;
            if (local_1a4 < fVar37 - fVar39) {
              iVar11 = 0;
            }
            if (iVar10 < 3) {
              iVar11 = 0;
            }
            uVar19 = (ulong)(uint)((int)uVar19 + iVar11);
            pcVar27 = pcVar27 + 1;
          } while (pcVar27 != local_b8);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar34);
      goto LAB_00115eb8;
    }
  }
  uVar19 = 0;
LAB_00115eb8:
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar19);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_198,(size_type)local_b8,
             (allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,(size_type)local_b8,
             (allocator_type *)&local_158);
  local_160 = local_b8;
  if ((long)local_b8 < 1) {
    iVar10 = 0;
  }
  else {
    pcVar27 = (char *)(local_78.width - local_78._0_8_ >> 2);
    pcVar30 = (char *)0x0;
    iVar10 = 0;
    do {
      if (pcVar30 == pcVar27) goto LAB_001163e9;
      *(undefined4 *)(local_78._0_8_ + (long)pcVar30 * 4) = 0xffffffff;
      uVar19 = (ulong)(int)local_c0;
      if ((long)uVar19 < 1) {
LAB_00115fa6:
        *(int *)(local_78._0_8_ + (long)pcVar30 * 4) = iVar10;
        iVar10 = iVar10 + 1;
      }
      else if ((*(uint *)(*(long *)*local_90 + (long)pcVar30 * 4) & 0x7fffffff) < 0x7f800000) {
        uVar16 = 1;
        do {
          uVar23 = uVar16;
          if (uVar19 == uVar23) break;
          uVar16 = uVar23 + 1;
        } while ((*(uint *)(*(long *)local_90[uVar23] + (long)pcVar30 * 4) & 0x7fffffff) <
                 0x7f800000);
        if (uVar19 <= uVar23) goto LAB_00115fa6;
      }
      pcVar30 = pcVar30 + 1;
    } while (pcVar30 != local_b8);
  }
  local_40 = local_b0;
  if (1 < local_b0) {
    lVar34 = 1;
    local_110 = local_90;
    uVar19 = 0;
    pIVar32 = &local_198;
    pIVar35 = &local_78;
    do {
      local_108 = pIVar35;
      piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar32->depth)->_M_impl).
               super__Vector_impl_data._M_start;
      if ((pointer)pIVar32->width == piVar3) goto LAB_001163fa;
      *piVar3 = -1;
      uVar16 = (ulong)(int)local_c0;
      if ((long)uVar16 < 1) {
LAB_00116086:
        *piVar3 = iVar10;
        iVar10 = iVar10 + 1;
      }
      else if ((**(uint **)(*local_90 + lVar34 * 8) & 0x7fffffff) < 0x7f800000) {
        uVar23 = 1;
        do {
          uVar20 = uVar23;
          if (uVar16 == uVar20) break;
          uVar23 = uVar20 + 1;
        } while ((**(uint **)(local_90[uVar20] + lVar34 * 8) & 0x7fffffff) < 0x7f800000);
        if (uVar16 <= uVar20) goto LAB_00116086;
      }
      local_140 = uVar19;
      pIVar33 = pIVar32;
      if (1 < (long)local_b8) {
        pcVar27 = (char *)0x1;
        local_38 = local_90;
        local_100 = pIVar32;
        do {
          piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar32->depth)->_M_impl).
                   super__Vector_impl_data._M_start;
          pcVar30 = (char *)((long)pIVar32->width - (long)piVar3 >> 2);
          if (pcVar30 <= pcVar27) {
            pcVar25 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            pcVar29 = pcVar27;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001163d8:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar29,pcVar25);
            pcVar27 = extraout_RDX;
            goto LAB_001163e9;
          }
          piVar3[(long)pcVar27] = -1;
          uVar19 = (ulong)(int)local_c0;
          if ((long)uVar19 < 1) {
LAB_0011614a:
            piVar3[(long)pcVar27] = iVar10;
            uVar19 = (ulong)local_c0;
            iVar11 = iVar10 + 1;
            local_1c0 = iVar10;
          }
          else {
            if ((*(uint *)(*(long *)(*local_90 + lVar34 * 8) + (long)pcVar27 * 4) & 0x7fffffff) <
                0x7f800000) {
              uVar16 = 1;
              do {
                uVar23 = uVar16;
                if (uVar19 == uVar23) break;
                uVar16 = uVar23 + 1;
              } while ((*(uint *)(*(long *)(local_90[uVar23] + lVar34 * 8) + (long)pcVar27 * 4) &
                       0x7fffffff) < 0x7f800000);
              if (uVar19 <= uVar23) goto LAB_0011614a;
            }
            local_1c0 = -1;
            iVar11 = iVar10;
          }
          iVar10 = iVar11;
          lVar12 = 0;
          iVar11 = 0;
          fVar37 = -3.4028235e+38;
          fVar39 = 3.4028235e+38;
          bVar36 = true;
          do {
            bVar17 = bVar36;
            lVar12 = lVar12 + lVar34;
            lVar22 = 0;
            bVar36 = true;
            do {
              bVar21 = bVar36;
              pcVar29 = pcVar27 + lVar22;
              if ((int)uVar19 < 1) {
                fVar1 = *(float *)(*(long *)(*local_90 + lVar12 * 8) + (long)pcVar29 * 4);
LAB_001161e4:
                fVar8 = fVar1;
                if (fVar39 <= fVar1) {
                  fVar8 = fVar39;
                }
                fVar39 = fVar8;
                if (fVar1 <= fVar37) {
                  fVar1 = fVar37;
                }
                iVar11 = iVar11 + 1;
                fVar37 = fVar1;
              }
              else {
                fVar1 = *(float *)(*(long *)(*local_90 + lVar12 * 8) + (long)pcVar29 * 4);
                if ((uint)ABS(fVar1) < 0x7f800000) {
                  uVar16 = 1;
                  do {
                    uVar23 = uVar16;
                    if (uVar19 == uVar23) break;
                    uVar16 = uVar23 + 1;
                  } while ((*(uint *)(*(long *)(local_90[uVar23] + lVar12 * 8) + (long)pcVar29 * 4)
                           & 0x7fffffff) < 0x7f800000);
                  if (uVar19 <= uVar23) goto LAB_001161e4;
                }
              }
              lVar22 = -1;
              bVar36 = false;
            } while (bVar21);
            lVar12 = -1;
            bVar36 = false;
          } while (bVar17);
          if ((2 < iVar11) && (fVar37 - fVar39 <= local_1a4)) {
            pcVar29 = pcVar27 + -1;
            piVar4 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar35->depth)->_M_impl).
                     super__Vector_impl_data._M_start;
            pcVar24 = (char *)((long)pIVar35->width - (long)piVar4 >> 2);
            pcVar25 = pcVar24;
            if (pcVar29 < pcVar24) {
              bVar36 = -1 < piVar4[(long)(pcVar27 + -1)];
              if (bVar36) {
                local_158 = CONCAT44(local_158._4_4_,piVar4[(long)(pcVar27 + -1)]);
              }
              pcVar25 = pcVar30;
              if (pcVar29 < pcVar30) {
                uVar19 = (ulong)bVar36;
                if (-1 < piVar3[(long)(pcVar27 + -1)]) {
                  uVar19 = (ulong)(bVar36 + 1);
                  *(int *)((long)&local_158 + (ulong)bVar36 * 4) = piVar3[(long)(pcVar27 + -1)];
                }
                uVar16 = uVar19;
                if (-1 < local_1c0) {
                  uVar16 = (ulong)((int)uVar19 + 1);
                  *(int *)((long)&local_158 + uVar19 * 4) = local_1c0;
                }
                pcVar29 = pcVar27;
                pcVar25 = pcVar24;
                if (pcVar27 < pcVar24) {
                  uVar19 = uVar16;
                  if (-1 < piVar4[(long)pcVar27]) {
                    uVar19 = (ulong)((int)uVar16 + 1);
                    *(int *)((long)&local_158 + uVar16 * 4) = piVar4[(long)pcVar27];
                  }
                  puVar5 = (this->super_Mesh).triangle;
                  iVar11 = (int)local_140;
                  puVar5[iVar11 * 3] = (uint)local_158;
                  (puVar5 + iVar11 * 3)[1] = local_158._4_4_;
                  puVar5[(long)(iVar11 * 3) + 2] = (uint)uStack_150;
                  uVar18 = iVar11 + 1;
                  if ((int)uVar19 == 4) {
                    lVar12 = (long)(int)(uVar18 * 3);
                    puVar5[lVar12] = (uint)uStack_150;
                    puVar5[lVar12 + 1] = uStack_150._4_4_;
                    puVar5[lVar12 + 2] = (uint)local_158;
                    uVar18 = iVar11 + 2;
                  }
                  local_140 = (ulong)uVar18;
                  goto LAB_0011633a;
                }
              }
            }
            goto LAB_001163d8;
          }
LAB_0011633a:
          pcVar27 = pcVar27 + 1;
          pIVar33 = local_100;
          pIVar32 = local_100;
        } while (pcVar27 != local_b8);
      }
      lVar34 = lVar34 + 1;
      uVar19 = local_140;
      pIVar32 = local_108;
      pIVar35 = pIVar33;
    } while (lVar34 != local_b0);
  }
  Mesh::recalculateNormals(&this->super_Mesh);
  if ((void *)local_78._0_8_ != (void *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((char *)local_198._0_8_ != (char *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  gimage::View::~View((View *)&local_f8);
  return (Model *)this;
LAB_001163e9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar27);
LAB_001163fa:
  uVar14 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  gimage::View::~View((View *)&local_f8);
  _Unwind_Resume(uVar14);
}

Assistant:

Model *loadDepth(const char *name, const char *spath, bool verbose)
{
  // load view

  gimage::View view;
  loadView(view, name, spath, verbose);

  // read optional maximum step size parameter

  float dstep=view.getDepthStep();

  std::vector<std::string> list;
  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "s=") == 0)
    {
      dstep=static_cast<float>(atof(list[i].substr(2).c_str()));
    }
  }

  // determine the number of valid points

  const gimage::ImageFloat &depth=view.getDepthImage();

  int n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        n++;
      }
    }
  }

  // create mesh

  Mesh *mesh=0;
  const gimage::ImageU8 *image=&view.getImage();

  if (image->getWidth() > 0 && image->getHeight() > 0)
  {
    ColoredMesh *cmesh=new ColoredMesh();
    cmesh->resizeVertexList(n, true, true);

    // resize image if required

    gimage::ImageU8 dsimage;

    {
      int ds=(image->getWidth()+depth.getWidth()-1)/depth.getWidth();

      if (ds > 1)
      {
        dsimage=gimage::downscaleImage(*image, ds);
        image=&dsimage;
      }
      else if (image->getWidth() < depth.getWidth() || image->getHeight() < depth.getHeight())
      {
        dsimage=gimage::resizeImageBilinear(*image, depth.getWidth(), depth.getHeight());
        image=&dsimage;
      }
    }

    // store colors

    n=0;

    for (long k=0; k<image->getHeight(); k++)
    {
      for (long i=0; i<image->getWidth(); i++)
      {
        if (depth.isValid(i, k))
        {
          if (image->getDepth() == 3)
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 1));
            cmesh->setColorComp(n, 2, image->get(i, k, 2));
          }
          else
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 0));
            cmesh->setColorComp(n, 2, image->get(i, k, 0));
          }

          n++;
        }
      }
    }

    mesh=cmesh;
  }
  else
  {
    mesh=new Mesh();
    mesh->resizeVertexList(n, true, true);
  }

  // reconstruct and store vertices

  const gmath::Camera *cam=view.getCamera();

  mesh->setOrigin(cam->getT());

  if (cam->isPerspective())
  {
    mesh->setDefCameraRT(cam->getR(), gmath::Vector3d());
  }

  n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        gmath::Vector2d p(i+0.5, k+0.5);
        double   d=depth.get(i, k);
        gmath::Vector3d P, P2;

        cam->reconstructPoint(P, p, d);

        mesh->setVertexComp(n, 0, static_cast<float>(P[0]-cam->getT()[0]));
        mesh->setVertexComp(n, 1, static_cast<float>(P[1]-cam->getT()[1]));
        mesh->setVertexComp(n, 2, static_cast<float>(P[2]-cam->getT()[2]));

        p[0]+=0.5;
        p[1]+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanSize(n, static_cast<float>(2*norm(P2-P)));

        p[0]-=0.5;
        p[1]-=0.5;
        d+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanError(n, static_cast<float>(norm(P2-P)));
        mesh->setScanConf(n, 1.0f);

        mesh->setScanPosComp(n, 0, 0.0f);
        mesh->setScanPosComp(n, 1, 0.0f);
        mesh->setScanPosComp(n, 2, 0.0f);

        n++;
      }
    }
  }

  // count number of triangles

  int tn=0;

  for (long k=1; k<depth.getHeight(); k++)
  {
    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        tn+=valid-2;
      }
    }
  }

  mesh->resizeTriangleList(tn);

  // create triangles

  std::vector<int> line0(depth.getWidth());
  std::vector<int> line1(depth.getWidth());
  std::vector<int> *l0=&line0;
  std::vector<int> *l1=&line1;

  n=0;
  tn=0;

  for (long i=0; i<depth.getWidth(); i++)
  {
    l1->at(i)=-1;

    if (depth.isValid(i, 0))
    {
      l1->at(i)=n++;
    }
  }

  for (long k=1; k<depth.getHeight(); k++)
  {
    std::vector<int> *t=l0;
    l0=l1;
    l1=t;

    l1->at(0)=-1;

    if (depth.isValid(0, k))
    {
      l1->at(0)=n++;
    }

    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      l1->at(i)=-1;

      if (depth.isValid(i, k))
      {
        l1->at(i)=n++;
      }

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        int j=0;
        int f[4];

        if (l0->at(i-1) >= 0)
        {
          f[j++]=l0->at(i-1);
        }

        if (l1->at(i-1) >= 0)
        {
          f[j++]=l1->at(i-1);
        }

        if (l1->at(i) >= 0)
        {
          f[j++]=l1->at(i);
        }

        if (l0->at(i) >= 0)
        {
          f[j++]=l0->at(i);
        }

        mesh->setTriangleIndex(tn, 0, f[0]);
        mesh->setTriangleIndex(tn, 1, f[1]);
        mesh->setTriangleIndex(tn, 2, f[2]);
        tn++;

        if (j == 4)
        {
          mesh->setTriangleIndex(tn, 0, f[2]);
          mesh->setTriangleIndex(tn, 1, f[3]);
          mesh->setTriangleIndex(tn, 2, f[0]);
          tn++;
        }
      }
    }
  }

  // compute normals

  mesh->recalculateNormals();

  return mesh;
}